

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

load_stats_status_t *
Statistics::loadFromFileStatistics(load_stats_status_t *__return_storage_ptr__,string *filename)

{
  total_game_stats_t stats;
  ifstream statistics;
  total_game_stats_t local_248;
  long local_218 [4];
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(local_218,(string *)filename,_S_in);
  if ((abStack_1f8[*(long *)(local_218[0] + -0x18)] & 5) == 0) {
    local_248.totalDuration = 0.0;
    local_248.winCount = 0;
    local_248.bestScore = 0;
    local_248.totalMoveCount = 0;
    local_248.gameCount = 0;
    operator>>((istream *)local_218,&local_248);
    *(ulong *)&(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>
               ).super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
               super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.winCount =
         CONCAT44(local_248._36_4_,local_248.winCount);
    *(ulong *)&(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>
               ).super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
               super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.gameCount =
         CONCAT44(local_248._20_4_,local_248.gameCount);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.totalDuration =
         local_248.totalDuration;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.bestScore =
         local_248.bestScore;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.totalMoveCount =
         local_248.totalMoveCount;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Head_base<0UL,_bool,_false>._M_head_impl = true;
  }
  else {
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.totalDuration = 0.0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.winCount = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Head_base<0UL,_bool,_false>._M_head_impl = false;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.bestScore = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.totalMoveCount = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.gameCount = 0;
  }
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

load_stats_status_t loadFromFileStatistics(std::string filename) {
  std::ifstream statistics(filename);
  if (statistics) {
    total_game_stats_t stats = generateStatsFromInputData(statistics);
    return load_stats_status_t{true, stats};
  }
  return load_stats_status_t{false, total_game_stats_t{}};
}